

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O0

int SUNLinSolSolve_SPBCGS(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,realtype delta)

{
  N_Vector y;
  N_Vector z;
  N_Vector z_00;
  N_Vector z_01;
  N_Vector z_02;
  N_Vector z_03;
  N_Vector z_04;
  N_Vector x_00;
  N_Vector y_00;
  undefined8 uVar1;
  undefined8 uVar2;
  code *pcVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  double *pdVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  realtype rVar13;
  double dVar14;
  double dVar15;
  N_Vector local_168;
  N_Vector local_158;
  N_Vector local_148;
  N_Vector Xv [3];
  realtype local_128;
  realtype cv [3];
  int *nli;
  realtype *res_norm;
  PSolveFn psolve;
  ATimesFn atimes;
  N_Vector sb;
  N_Vector sx;
  void *P_data;
  void *A_data;
  int ier;
  int l_max;
  int l;
  int converged;
  int scale_b;
  int scale_x;
  int preOnRight;
  int preOnLeft;
  N_Vector vtemp;
  N_Vector Ap;
  N_Vector u;
  N_Vector q;
  N_Vector p;
  N_Vector r;
  N_Vector r_star;
  realtype rho;
  realtype r_norm;
  realtype beta_denom;
  realtype beta_num;
  realtype omega_denom;
  realtype omega;
  realtype beta;
  realtype alpha;
  realtype delta_local;
  N_Vector b_local;
  N_Vector x_local;
  SUNMatrix A_local;
  SUNLinearSolver S_local;
  
  if (S == (SUNLinearSolver)0x0) {
    S_local._4_4_ = -1;
  }
  else {
    iVar7 = *S->content;
    y = *(N_Vector *)((long)S->content + 0x60);
    z = *(N_Vector *)((long)S->content + 0x58);
    z_00 = *(N_Vector *)((long)S->content + 0x68);
    z_01 = *(N_Vector *)((long)S->content + 0x70);
    z_02 = *(N_Vector *)((long)S->content + 0x78);
    z_03 = *(N_Vector *)((long)S->content + 0x80);
    z_04 = *(N_Vector *)((long)S->content + 0x88);
    x_00 = *(N_Vector *)((long)S->content + 0x48);
    y_00 = *(N_Vector *)((long)S->content + 0x50);
    uVar1 = *(undefined8 *)((long)S->content + 0x28);
    uVar2 = *(undefined8 *)((long)S->content + 0x40);
    pcVar3 = *(code **)((long)S->content + 0x20);
    pcVar4 = *(code **)((long)S->content + 0x38);
    cv[2] = (realtype)((long)S->content + 8);
    pdVar8 = (double *)((long)S->content + 0x10);
    *(undefined4 *)cv[2] = 0;
    bVar5 = false;
    bVar9 = true;
    if (*(int *)((long)S->content + 4) != 1) {
      bVar9 = *(int *)((long)S->content + 4) == 3;
    }
    bVar10 = true;
    if (*(int *)((long)S->content + 4) != 2) {
      bVar10 = *(int *)((long)S->content + 4) == 3;
    }
    bVar11 = y_00 != (N_Vector)0x0;
    bVar12 = x_00 == (N_Vector)0x0;
    rVar13 = N_VDotProd(x,x);
    if ((rVar13 != 0.0) || (NAN(rVar13))) {
      iVar6 = (*pcVar3)(uVar1,x,y);
      if (iVar6 != 0) {
        iVar7 = 3;
        if (iVar6 < 0) {
          iVar7 = -4;
        }
        *(long *)((long)S->content + 0x18) = (long)iVar7;
        return (int)*(undefined8 *)((long)S->content + 0x18);
      }
      N_VLinearSum(1.0,b,-1.0,y,y);
    }
    else {
      N_VScale(1.0,b,y);
    }
    if (bVar9) {
      iVar6 = (*pcVar4)(delta,uVar2,y,z,1);
      if (iVar6 != 0) {
        iVar7 = 5;
        if (iVar6 < 0) {
          iVar7 = -6;
        }
        *(long *)((long)S->content + 0x18) = (long)iVar7;
        return (int)*(undefined8 *)((long)S->content + 0x18);
      }
    }
    else {
      N_VScale(1.0,y,z);
    }
    if (bVar12) {
      N_VScale(1.0,z,y);
    }
    else {
      N_VProd(x_00,z,y);
    }
    r_norm = N_VDotProd(y,y);
    if (0.0 < r_norm) {
      local_158 = (N_Vector)sqrt(r_norm);
    }
    else {
      local_158 = (N_Vector)0x0;
    }
    r_star = local_158;
    *pdVar8 = (double)local_158;
    if (delta < (double)local_158) {
      N_VScale(1.0,y,z);
      N_VScale(1.0,y,z_00);
      for (ier = 0; ier < iVar7; ier = ier + 1) {
        *(int *)cv[2] = *(int *)cv[2] + 1;
        if (bVar11) {
          N_VDiv(z_00,y_00,z_04);
        }
        else {
          N_VScale(1.0,z_00,z_04);
        }
        if (bVar10) {
          N_VScale(1.0,z_04,z_03);
          iVar6 = (*pcVar4)(delta,uVar2,z_03,z_04,2);
          if (iVar6 != 0) {
            iVar7 = 5;
            if (iVar6 < 0) {
              iVar7 = -6;
            }
            *(long *)((long)S->content + 0x18) = (long)iVar7;
            return (int)*(undefined8 *)((long)S->content + 0x18);
          }
        }
        iVar6 = (*pcVar3)(uVar1,z_04,z_03);
        if (iVar6 != 0) {
          iVar7 = 3;
          if (iVar6 < 0) {
            iVar7 = -4;
          }
          *(long *)((long)S->content + 0x18) = (long)iVar7;
          return (int)*(undefined8 *)((long)S->content + 0x18);
        }
        if (bVar9) {
          iVar6 = (*pcVar4)(delta,uVar2,z_03,z_04,1);
          if (iVar6 != 0) {
            iVar7 = 5;
            if (iVar6 < 0) {
              iVar7 = -6;
            }
            *(long *)((long)S->content + 0x18) = (long)iVar7;
            return (int)*(undefined8 *)((long)S->content + 0x18);
          }
        }
        else {
          N_VScale(1.0,z_03,z_04);
        }
        if (bVar12) {
          N_VScale(1.0,z_04,z_03);
        }
        else {
          N_VProd(x_00,z_04,z_03);
        }
        rVar13 = N_VDotProd(z_03,y);
        dVar14 = r_norm / rVar13;
        N_VLinearSum(1.0,z,-dVar14,z_03,z_01);
        if (bVar11) {
          N_VDiv(z_01,y_00,z_04);
        }
        else {
          N_VScale(1.0,z_01,z_04);
        }
        if (bVar10) {
          N_VScale(1.0,z_04,z_02);
          iVar6 = (*pcVar4)(delta,uVar2,z_02,z_04,2);
          if (iVar6 != 0) {
            iVar7 = 5;
            if (iVar6 < 0) {
              iVar7 = -6;
            }
            *(long *)((long)S->content + 0x18) = (long)iVar7;
            return (int)*(undefined8 *)((long)S->content + 0x18);
          }
        }
        iVar6 = (*pcVar3)(uVar1,z_04,z_02);
        if (iVar6 != 0) {
          iVar7 = 3;
          if (iVar6 < 0) {
            iVar7 = -4;
          }
          *(long *)((long)S->content + 0x18) = (long)iVar7;
          return (int)*(undefined8 *)((long)S->content + 0x18);
        }
        if (bVar9) {
          iVar6 = (*pcVar4)(delta,uVar2,z_02,z_04,1);
          if (iVar6 != 0) {
            iVar7 = 5;
            if (iVar6 < 0) {
              iVar7 = -6;
            }
            *(long *)((long)S->content + 0x18) = (long)iVar7;
            return (int)*(undefined8 *)((long)S->content + 0x18);
          }
        }
        else {
          N_VScale(1.0,z_02,z_04);
        }
        if (bVar12) {
          N_VScale(1.0,z_04,z_02);
        }
        else {
          N_VProd(x_00,z_04,z_02);
        }
        beta_num = N_VDotProd(z_02,z_02);
        if ((beta_num == 0.0) && (!NAN(beta_num))) {
          beta_num = 1.0;
        }
        rVar13 = N_VDotProd(z_02,z_01);
        dVar15 = rVar13 / beta_num;
        local_128 = 1.0;
        local_148 = x;
        Xv[0] = z_00;
        Xv[1] = z_01;
        cv[0] = dVar14;
        cv[1] = dVar15;
        iVar6 = N_VLinearCombination(3,&local_128,&local_148,x);
        if (iVar6 != 0) {
          return -10;
        }
        N_VLinearSum(1.0,z_01,-dVar15,z_02,z);
        rVar13 = N_VDotProd(z,z);
        if (0.0 < rVar13) {
          rVar13 = N_VDotProd(z,z);
          local_168 = (N_Vector)sqrt(rVar13);
        }
        else {
          local_168 = (N_Vector)0x0;
        }
        r_star = local_168;
        *pdVar8 = (double)local_168;
        if ((double)local_168 <= delta) {
          bVar5 = true;
          break;
        }
        rVar13 = N_VDotProd(z,y);
        local_128 = (rVar13 / r_norm) * (dVar14 / dVar15);
        cv[0] = -dVar14 * (rVar13 / r_norm);
        cv[1] = 1.0;
        local_148 = z_00;
        Xv[0] = z_03;
        Xv[1] = z;
        iVar6 = N_VLinearCombination(3,&local_128,&local_148,z_00);
        if (iVar6 != 0) {
          return -10;
        }
        r_norm = rVar13;
      }
      if ((bVar5) || ((double)r_star < (double)local_158)) {
        if (bVar11) {
          N_VDiv(x,y_00,x);
        }
        if (bVar10) {
          iVar7 = (*pcVar4)(delta,uVar2,x,z_04,2);
          if (iVar7 != 0) {
            iVar6 = 5;
            if (iVar7 < 0) {
              iVar6 = -6;
            }
            *(long *)((long)S->content + 0x18) = (long)iVar6;
            return (int)*(undefined8 *)((long)S->content + 0x18);
          }
          N_VScale(1.0,z_04,x);
        }
        if (bVar5) {
          *(undefined8 *)((long)S->content + 0x18) = 0;
        }
        else {
          *(undefined8 *)((long)S->content + 0x18) = 1;
        }
        S_local._4_4_ = (int)*(undefined8 *)((long)S->content + 0x18);
      }
      else {
        *(undefined8 *)((long)S->content + 0x18) = 2;
        S_local._4_4_ = (int)*(undefined8 *)((long)S->content + 0x18);
      }
    }
    else {
      *(undefined8 *)((long)S->content + 0x18) = 0;
      S_local._4_4_ = (int)*(undefined8 *)((long)S->content + 0x18);
    }
  }
  return S_local._4_4_;
}

Assistant:

int SUNLinSolSolve_SPBCGS(SUNLinearSolver S, SUNMatrix A, N_Vector x, 
                          N_Vector b, realtype delta)
{
  /* local data and shortcut variables */
  realtype alpha, beta, omega, omega_denom, beta_num, beta_denom, r_norm, rho;
  N_Vector r_star, r, p, q, u, Ap, vtemp;
  booleantype preOnLeft, preOnRight, scale_x, scale_b, converged;
  int l, l_max, ier;
  void *A_data, *P_data;
  N_Vector sx, sb;
  ATimesFn atimes;
  PSolveFn psolve;
  realtype *res_norm;
  int *nli;

  /* local variables for fused vector operations */
  realtype cv[3];
  N_Vector Xv[3];
  
  /* Make local shorcuts to solver variables. */
  if (S == NULL) return(SUNLS_MEM_NULL);
  l_max        = SPBCGS_CONTENT(S)->maxl;
  r_star       = SPBCGS_CONTENT(S)->r_star;
  r            = SPBCGS_CONTENT(S)->r;
  p            = SPBCGS_CONTENT(S)->p;
  q            = SPBCGS_CONTENT(S)->q;
  u            = SPBCGS_CONTENT(S)->u;
  Ap           = SPBCGS_CONTENT(S)->Ap;
  vtemp        = SPBCGS_CONTENT(S)->vtemp;
  sb           = SPBCGS_CONTENT(S)->s1;
  sx           = SPBCGS_CONTENT(S)->s2;
  A_data       = SPBCGS_CONTENT(S)->ATData;
  P_data       = SPBCGS_CONTENT(S)->PData;
  atimes       = SPBCGS_CONTENT(S)->ATimes;
  psolve       = SPBCGS_CONTENT(S)->Psolve;
  nli          = &(SPBCGS_CONTENT(S)->numiters);
  res_norm     = &(SPBCGS_CONTENT(S)->resnorm);

  /* Initialize counters and convergence flag */
  *nli = 0;
  converged = SUNFALSE;

  /* set booleantype flags for internal solver options */
  preOnLeft  = ( (PRETYPE(S) == PREC_LEFT) || 
                 (PRETYPE(S) == PREC_BOTH) );
  preOnRight = ( (PRETYPE(S) == PREC_RIGHT) || 
                 (PRETYPE(S) == PREC_BOTH) );
  scale_x = (sx != NULL);
  scale_b = (sb != NULL);

  /* Set r_star to initial (unscaled) residual r_0 = b - A*x_0 */

  if (N_VDotProd(x, x) == ZERO) N_VScale(ONE, b, r_star);
  else {
    ier = atimes(A_data, x, r_star);
    if (ier != 0) {
      LASTFLAG(S) = (ier < 0) ?
        SUNLS_ATIMES_FAIL_UNREC : SUNLS_ATIMES_FAIL_REC;
      return(LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, r_star, r_star);
  }

  /* Apply left preconditioner and b-scaling to r_star = r_0 */

  if (preOnLeft) {
    ier = psolve(P_data, r_star, r, delta, PREC_LEFT);
    if (ier != 0) {
      LASTFLAG(S) = (ier < 0) ?
        SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
      return(LASTFLAG(S));
    }
  }
  else N_VScale(ONE, r_star, r);

  if (scale_b) N_VProd(sb, r, r_star);
  else N_VScale(ONE, r, r_star);

  /* Initialize beta_denom to the dot product of r0 with r0 */

  beta_denom = N_VDotProd(r_star, r_star);

  /* Set r_norm to L2 norm of r_star = sb P1_inv r_0, and
     return if small */

  *res_norm = r_norm = rho = SUNRsqrt(beta_denom);
  if (r_norm <= delta) {
    LASTFLAG(S) = SUNLS_SUCCESS;
    return(LASTFLAG(S));
  }

  /* Copy r_star to r and p */

  N_VScale(ONE, r_star, r);
  N_VScale(ONE, r_star, p);

  /* Begin main iteration loop */

  for(l = 0; l < l_max; l++) {

    (*nli)++;

    /* Generate Ap = A-tilde p, where A-tilde = sb P1_inv A P2_inv sx_inv */

    /*   Apply x-scaling: vtemp = sx_inv p */

    if (scale_x) N_VDiv(p, sx, vtemp);
    else N_VScale(ONE, p, vtemp);

    /*   Apply right preconditioner: vtemp = P2_inv sx_inv p */

    if (preOnRight) {
      N_VScale(ONE, vtemp, Ap);
      ier = psolve(P_data, Ap, vtemp, delta, PREC_RIGHT);
      if (ier != 0) {
        LASTFLAG(S) = (ier < 0) ?
          SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
        return(LASTFLAG(S));
      }
    }

    /*   Apply A: Ap = A P2_inv sx_inv p */

    ier = atimes(A_data, vtemp, Ap );
    if (ier != 0) {
      LASTFLAG(S) = (ier < 0) ?
        SUNLS_ATIMES_FAIL_UNREC : SUNLS_ATIMES_FAIL_REC;
      return(LASTFLAG(S));
    }

    /*   Apply left preconditioner: vtemp = P1_inv A P2_inv sx_inv p */

    if (preOnLeft) {
      ier = psolve(P_data, Ap, vtemp, delta, PREC_LEFT);
      if (ier != 0) {
        LASTFLAG(S) = (ier < 0) ?
          SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
        return(LASTFLAG(S));
      }
    }
    else N_VScale(ONE, Ap, vtemp);

    /*   Apply b-scaling: Ap = sb P1_inv A P2_inv sx_inv p */

    if (scale_b) N_VProd(sb, vtemp, Ap);
    else N_VScale(ONE, vtemp, Ap);


    /* Calculate alpha = <r,r_star>/<Ap,r_star> */

    alpha = ((beta_denom / N_VDotProd(Ap, r_star)));

    /* Update q = r - alpha*Ap = r - alpha*(sb P1_inv A P2_inv sx_inv p) */

    N_VLinearSum(ONE, r, -alpha, Ap, q);

    /* Generate u = A-tilde q */

    /*   Apply x-scaling: vtemp = sx_inv q */

    if (scale_x) N_VDiv(q, sx, vtemp);
    else N_VScale(ONE, q, vtemp);

    /*   Apply right preconditioner: vtemp = P2_inv sx_inv q */

    if (preOnRight) {
      N_VScale(ONE, vtemp, u);
      ier = psolve(P_data, u, vtemp, delta, PREC_RIGHT);
      if (ier != 0) {
        LASTFLAG(S) = (ier < 0) ?
          SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
        return(LASTFLAG(S));
      }
    }

    /*   Apply A: u = A P2_inv sx_inv u */

    ier = atimes(A_data, vtemp, u );
    if (ier != 0) {
      LASTFLAG(S) = (ier < 0) ?
        SUNLS_ATIMES_FAIL_UNREC : SUNLS_ATIMES_FAIL_REC;
      return(LASTFLAG(S));
    }

    /*   Apply left preconditioner: vtemp = P1_inv A P2_inv sx_inv p */

    if (preOnLeft) {
      ier = psolve(P_data, u, vtemp, delta, PREC_LEFT);
      if (ier != 0) {
        LASTFLAG(S) = (ier < 0) ?
          SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
        return(LASTFLAG(S));
      }
    }
    else N_VScale(ONE, u, vtemp);

    /*   Apply b-scaling: u = sb P1_inv A P2_inv sx_inv u */

    if (scale_b) N_VProd(sb, vtemp, u);
    else N_VScale(ONE, vtemp, u);


    /* Calculate omega = <u,q>/<u,u> */

    omega_denom = N_VDotProd(u, u);
    if (omega_denom == ZERO) omega_denom = ONE;
    omega = (N_VDotProd(u, q) / omega_denom);

    /* Update x = x + alpha*p + omega*q */
    cv[0] = ONE;
    Xv[0] = x;

    cv[1] = alpha;
    Xv[1] = p;

    cv[2] = omega;
    Xv[2] = q;

    ier = N_VLinearCombination(3, cv, Xv, x);
    if (ier != SUNLS_SUCCESS) return(SUNLS_VECTOROP_ERR);

    /* Update the residual r = q - omega*u */

    N_VLinearSum(ONE, q, -omega, u, r);

    /* Set rho = norm(r) and check convergence */

    *res_norm = rho = SUNRsqrt(N_VDotProd(r, r));
    if (rho <= delta) {
      converged = SUNTRUE;
      break;
    }

    /* Not yet converged, continue iteration */
    /* Update beta = <rnew,r_star> / <rold,r_start> * alpha / omega */

    beta_num = N_VDotProd(r, r_star);
    beta = ((beta_num / beta_denom) * (alpha / omega));

    /* Update p = r + beta*(p - omega*Ap) = beta*p - beta*omega*Ap + r */
    cv[0] = beta;
    Xv[0] = p;

    cv[1] = -alpha*(beta_num / beta_denom);
    Xv[1] = Ap;

    cv[2] = ONE;
    Xv[2] = r;

    ier = N_VLinearCombination(3, cv, Xv, p);
    if (ier != SUNLS_SUCCESS) return(SUNLS_VECTOROP_ERR);

    /* udpate beta_denom for next iteration */
    beta_denom = beta_num;
  }

  /* Main loop finished */

  if ((converged == SUNTRUE) || (rho < r_norm)) {

    /* Apply the x-scaling and right preconditioner: x = P2_inv sx_inv x */

    if (scale_x) N_VDiv(x, sx, x);
    if (preOnRight) {
      ier = psolve(P_data, x, vtemp, delta, PREC_RIGHT);
      if (ier != 0) {
        LASTFLAG(S) = (ier < 0) ?
          SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
        return(LASTFLAG(S));
      }
      N_VScale(ONE, vtemp, x);
    }

    if (converged == SUNTRUE) 
      LASTFLAG(S) = SUNLS_SUCCESS;
    else 
      LASTFLAG(S) = SUNLS_RES_REDUCED;
    return(LASTFLAG(S));
    
  }
  else {
    LASTFLAG(S) = SUNLS_CONV_FAIL;
    return(LASTFLAG(S));
  }
}